

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool ContextualCheckBlockHeader
               (CBlockHeader *block,BlockValidationState *state,BlockManager *blockman,
               ChainstateManager *chainman,CBlockIndex *pindexPrev)

{
  uint uVar1;
  long lVar2;
  CChainParams *params;
  string_view source_file;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  CBlockIndex *pCVar6;
  Logger *pLVar7;
  int64_t iVar8;
  ulong uVar9;
  time_point tVar10;
  CBlockIndex *args_1;
  int iVar11;
  long lVar12;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int nHeight;
  allocator<char> local_b8 [32];
  allocator<char> local_98 [32];
  string local_78;
  string log_msg;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindexPrev == (CBlockIndex *)0x0) {
    __assert_fail("pindexPrev != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x1042,
                  "bool ContextualCheckBlockHeader(const CBlockHeader &, BlockValidationState &, BlockManager &, const ChainstateManager &, const CBlockIndex *)"
                 );
  }
  lVar12 = (long)pindexPrev->nHeight + 1;
  iVar11 = (int)lVar12;
  params = (chainman->m_options).chainparams;
  uVar1 = block->nBits;
  args_1 = pindexPrev;
  nHeight = iVar11;
  uVar5 = GetNextWorkRequired(pindexPrev,block,&params->consensus);
  if (uVar1 == uVar5) {
    if ((chainman->m_options).checkpoints_enabled == true) {
      pCVar6 = node::BlockManager::GetLastCheckpoint
                         (blockman,&((chainman->m_options).chainparams)->checkpointData);
      if ((pCVar6 != (CBlockIndex *)0x0) && (iVar11 < pCVar6->nHeight)) {
        pLVar7 = LogInstance();
        bVar3 = BCLog::Logger::Enabled(pLVar7);
        if (bVar3) {
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          tinyformat::format<char[27],int>
                    (&local_78,
                     (tinyformat *)
                     "ERROR: %s: forked chain older than last checkpoint (height %d)\n",
                     "ContextualCheckBlockHeader",(char (*) [27])&nHeight,(int *)args_1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          pLVar7 = LogInstance();
          local_78._M_dataplus._M_p = (pointer)0x57;
          local_78._M_string_length = 0x6d76f9;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file._M_len = 0x57;
          str._M_str = log_msg._M_dataplus._M_p;
          str._M_len = log_msg._M_string_length;
          logging_function._M_str = "ContextualCheckBlockHeader";
          logging_function._M_len = 0x1a;
          BCLog::Logger::LogPrintStr(pLVar7,str,logging_function,source_file,0x1051,ALL,Info);
          std::__cxx11::string::~string((string *)&log_msg);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&log_msg,"bad-fork-prior-to-checkpoint",local_98);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",local_b8);
        bVar3 = ValidationState<BlockValidationResult>::Invalid
                          (&state->super_ValidationState<BlockValidationResult>,BLOCK_CHECKPOINT,
                           &log_msg,&local_78);
        goto LAB_0036c31f;
      }
    }
    uVar1 = block->nTime;
    iVar8 = CBlockIndex::GetMedianTimePast(pindexPrev);
    if (iVar8 < (long)(ulong)uVar1) {
      if ((params->consensus).enforce_BIP94 == false) {
        uVar9 = (ulong)block->nTime;
      }
      else {
        uVar9 = (ulong)block->nTime;
        if ((lVar12 % ((params->consensus).nPowTargetTimespan /
                      (params->consensus).nPowTargetSpacing) == 0) &&
           ((long)uVar9 < (long)((ulong)pindexPrev->nTime - 600))) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&log_msg,"time-timewarp-attack",local_98);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"block\'s timestamp is too early on diff adjustment block",
                     local_b8);
          bVar3 = ValidationState<BlockValidationResult>::Invalid
                            (&state->super_ValidationState<BlockValidationResult>,
                             BLOCK_INVALID_HEADER,&log_msg,&local_78);
          goto LAB_0036c31f;
        }
      }
      tVar10 = NodeClock::now();
      if (uVar9 * 1000000000 - ((long)tVar10.__d.__r + 7200000000000) == 0 ||
          (long)(uVar9 * 1000000000) < (long)tVar10.__d.__r + 7200000000000) {
        iVar11 = block->nVersion;
        if (iVar11 < 2) {
          bVar3 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                            (pindexPrev,chainman,DEPLOYMENT_HEIGHTINCB);
          if (!bVar3) {
            iVar11 = block->nVersion;
            goto LAB_0036c28f;
          }
        }
        else {
LAB_0036c28f:
          if (iVar11 < 3) {
            bVar3 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                              (pindexPrev,chainman,DEPLOYMENT_DERSIG);
            if (bVar3) goto LAB_0036c2cf;
            iVar11 = block->nVersion;
          }
          bVar3 = true;
          if (3 < iVar11) goto LAB_0036c33b;
          bVar4 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                            (pindexPrev,chainman,DEPLOYMENT_CLTV);
          if (!bVar4) goto LAB_0036c33b;
        }
LAB_0036c2cf:
        tinyformat::format<int>(&log_msg,"bad-version(0x%08x)",&block->nVersion);
        tinyformat::format<int>(&local_78,"rejected nVersion=0x%08x block",&block->nVersion);
        bVar3 = ValidationState<BlockValidationResult>::Invalid
                          (&state->super_ValidationState<BlockValidationResult>,BLOCK_INVALID_HEADER
                           ,&log_msg,&local_78);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&log_msg,"time-too-new",local_98);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"block timestamp too far in the future",local_b8);
        bVar3 = ValidationState<BlockValidationResult>::Invalid
                          (&state->super_ValidationState<BlockValidationResult>,BLOCK_TIME_FUTURE,
                           &log_msg,&local_78);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&log_msg,"time-too-old",local_98)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"block\'s timestamp is too early",local_b8);
      bVar3 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_INVALID_HEADER,
                         &log_msg,&local_78);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&log_msg,"bad-diffbits",local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"incorrect proof of work",local_b8);
    bVar3 = ValidationState<BlockValidationResult>::Invalid
                      (&state->super_ValidationState<BlockValidationResult>,BLOCK_INVALID_HEADER,
                       &log_msg,&local_78);
  }
LAB_0036c31f:
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&log_msg);
LAB_0036c33b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    AssertLockHeld(::cs_main);
    assert(pindexPrev != nullptr);
    const int nHeight = pindexPrev->nHeight + 1;

    // Check proof of work
    const Consensus::Params& consensusParams = chainman.GetConsensus();
    if (block.nBits != GetNextWorkRequired(pindexPrev, &block, consensusParams))
        return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "bad-diffbits", "incorrect proof of work");

    // Check against checkpoints
    if (chainman.m_options.checkpoints_enabled) {
        // Don't accept any forks from the main chain prior to last checkpoint.
        // GetLastCheckpoint finds the last checkpoint in MapCheckpoints that's in our
        // BlockIndex().
        const CBlockIndex* pcheckpoint = blockman.GetLastCheckpoint(chainman.GetParams().Checkpoints());
        if (pcheckpoint && nHeight < pcheckpoint->nHeight) {
            LogPrintf("ERROR: %s: forked chain older than last checkpoint (height %d)\n", __func__, nHeight);
            return state.Invalid(BlockValidationResult::BLOCK_CHECKPOINT, "bad-fork-prior-to-checkpoint");
        }
    }

    // Check timestamp against prev
    if (block.GetBlockTime() <= pindexPrev->GetMedianTimePast())
        return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "time-too-old", "block's timestamp is too early");

    // Testnet4 and regtest only: Check timestamp against prev for difficulty-adjustment
    // blocks to prevent timewarp attacks (see https://github.com/bitcoin/bitcoin/pull/15482).
    if (consensusParams.enforce_BIP94) {
        // Check timestamp for the first block of each difficulty adjustment
        // interval, except the genesis block.
        if (nHeight % consensusParams.DifficultyAdjustmentInterval() == 0) {
            if (block.GetBlockTime() < pindexPrev->GetBlockTime() - MAX_TIMEWARP) {
                return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "time-timewarp-attack", "block's timestamp is too early on diff adjustment block");
            }
        }
    }

    // Check timestamp
    if (block.Time() > NodeClock::now() + std::chrono::seconds{MAX_FUTURE_BLOCK_TIME}) {
        return state.Invalid(BlockValidationResult::BLOCK_TIME_FUTURE, "time-too-new", "block timestamp too far in the future");
    }

    // Reject blocks with outdated version
    if ((block.nVersion < 2 && DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_HEIGHTINCB)) ||
        (block.nVersion < 3 && DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_DERSIG)) ||
        (block.nVersion < 4 && DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_CLTV))) {
            return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, strprintf("bad-version(0x%08x)", block.nVersion),
                                 strprintf("rejected nVersion=0x%08x block", block.nVersion));
    }

    return true;
}